

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainGoalPredictor.cpp
# Opt level: O2

pair<tiger::trains::world::IPost_*,_int> __thiscall
tiger::trains::ai::TrainGoalPredictor::predictGoal(TrainGoalPredictor *this,Train *train)

{
  mapped_type mVar1;
  pointer ppPVar2;
  pointer ppLVar3;
  pointer ppIVar4;
  IPost *pIVar5;
  Train *pTVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  GoodType GVar10;
  World *pWVar11;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *pvVar12;
  mapped_type *pmVar13;
  Line *pLVar14;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar15;
  Player *this_00;
  IPost *pIVar16;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppIVar18;
  pointer ppLVar19;
  pointer ppPVar20;
  pair<tiger::trains::world::IPost_*,_int> pVar21;
  Point *another;
  Point *minPoint;
  Point *endPoint;
  Point *startPoint;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  setMinLen;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  minLen;
  Point *local_c8;
  Point *local_c0;
  pair<int,_const_tiger::trains::world::Point_*> local_b8;
  Train *local_a8;
  Point *local_a0;
  Point *local_98;
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  local_90;
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = train;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pWVar11 = world::Train::getWorld(train);
  pvVar12 = world::World::getPointList(pWVar11);
  ppPVar2 = (pvVar12->
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar20 = (pvVar12->
                  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; pTVar6 = local_a8, ppPVar20 != ppPVar2
      ; ppPVar20 = ppPVar20 + 1) {
    local_90._M_impl._0_8_ = *ppPVar20;
    pmVar13 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                            *)&local_60,(key_type *)&local_90);
    *pmVar13 = 0x7fffffff;
  }
  pLVar14 = world::Train::getLine(local_a8);
  local_98 = world::Line::getStartPont(pLVar14);
  iVar7 = world::Train::getPosition(pTVar6);
  pLVar14 = world::Train::getLine(pTVar6);
  local_a0 = world::Line::getEndPont(pLVar14);
  pLVar14 = world::Train::getLine(pTVar6);
  iVar8 = world::Line::getLenght(pLVar14);
  iVar9 = world::Train::getPosition(pTVar6);
  pmVar13 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,&local_98);
  *pmVar13 = iVar7;
  pmVar13 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,&local_a0);
  *pmVar13 = iVar8 - iVar9;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.second = local_98;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8.first = iVar7;
  std::
  _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
  ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
            ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
              *)&local_90,&local_b8);
  local_b8.first = iVar8 - iVar9;
  local_b8.second = local_a0;
  std::
  _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
  ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
            ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
              *)&local_90,&local_b8);
  while (pTVar6 = local_a8, local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_c0 = *(Point **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    std::
    _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                        *)&local_90,
                       (const_iterator)local_90._M_impl.super__Rb_tree_header._M_header._M_left);
    pvVar15 = world::Point::getEdges(local_c0);
    ppLVar3 = (pvVar15->
              super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar19 = (pvVar15->
                    super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppLVar19 != ppLVar3;
        ppLVar19 = ppLVar19 + 1) {
      pLVar14 = *ppLVar19;
      local_c8 = world::Line::getAnotherPoint(pLVar14,local_c0);
      pmVar13 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                              *)&local_60,&local_c8);
      iVar7 = *pmVar13;
      pmVar13 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                              *)&local_60,&local_c0);
      iVar8 = *pmVar13;
      iVar9 = world::Line::getLenght(pLVar14);
      if (iVar9 + iVar8 < iVar7) {
        pmVar13 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                *)&local_60,&local_c8);
        local_b8.second = local_c8;
        local_b8.first = *pmVar13;
        std::
        _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
        ::erase(&local_90,&local_b8);
        pmVar13 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                *)&local_60,&local_c0);
        iVar7 = *pmVar13;
        iVar8 = world::Line::getLenght(pLVar14);
        pmVar13 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                *)&local_60,&local_c8);
        *pmVar13 = iVar8 + iVar7;
        pmVar13 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                *)&local_60,&local_c8);
        local_b8.first = *pmVar13;
        local_b8.second = local_c8;
        std::
        _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
                  ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                    *)&local_90,&local_b8);
      }
    }
  }
  this_00 = world::Train::getPlayer(local_a8);
  pIVar16 = world::Player::getHome(this_00);
  pWVar11 = world::Train::getWorld(pTVar6);
  pvVar17 = world::World::getPostList(pWVar11);
  ppIVar4 = (pvVar17->
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar18 = (pvVar17->
                  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppIVar18 != ppIVar4;
      ppIVar18 = ppIVar18 + 1) {
    pIVar5 = *ppIVar18;
    local_b8.first = (*pIVar16->_vptr_IPost[5])(pIVar16);
    local_b8._4_4_ = extraout_var;
    pmVar13 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                            *)&local_60,(key_type *)&local_b8);
    iVar7 = *pmVar13;
    iVar8 = (*pIVar5->_vptr_IPost[5])(pIVar5);
    local_c0 = (Point *)CONCAT44(extraout_var_00,iVar8);
    pmVar13 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                            *)&local_60,&local_c0);
    if (*pmVar13 < iVar7) {
      iVar7 = (*pIVar5->_vptr_IPost[7])(pIVar5);
      if (iVar7 == 2) {
        GVar10 = world::Train::getGoodsType(local_a8);
        if (GVar10 == PRODUCT) {
          pIVar16 = pIVar5;
        }
      }
      iVar7 = (*pIVar5->_vptr_IPost[7])(pIVar5);
      if (iVar7 == 3) {
        GVar10 = world::Train::getGoodsType(local_a8);
        if (GVar10 == ARMOR) {
          pIVar16 = pIVar5;
        }
      }
    }
  }
  local_b8.first = (*pIVar16->_vptr_IPost[5])(pIVar16);
  local_b8._4_4_ = extraout_var_01;
  pmVar13 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,(key_type *)&local_b8);
  mVar1 = *pmVar13;
  std::
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~_Rb_tree(&local_60);
  pVar21.second = mVar1;
  pVar21.first = pIVar16;
  pVar21._12_4_ = 0;
  return pVar21;
}

Assistant:

std::pair<world::IPost *, int> TrainGoalPredictor::predictGoal(const world::Train *train)
{
    std::map<const world::Point *, int> minLen;

    for (auto point : train->getWorld()->getPointList())
        minLen[point] = INT_MAX;

    const world::Point *startPoint = train->getLine()->getStartPont();
    int lenToStart = train->getPosition();
    const world::Point *endPoint = train->getLine()->getEndPont();
    int lenToEnd = train->getLine()->getLenght() - train->getPosition();

    minLen[startPoint] = lenToStart;
    minLen[endPoint] = lenToEnd;

    std::set< std::pair<int, const world::Point *>> setMinLen;
    setMinLen.insert({lenToStart, startPoint});
    setMinLen.insert({lenToEnd, endPoint});

    while (!setMinLen.empty())
    {
        auto minPoint = minLen.begin()->first;
        setMinLen.erase(setMinLen.begin());

        for (auto line : minPoint->getEdges())
        {
            const world::Point *another = line->getAnotherPoint(minPoint);

            if (minLen[another] > minLen[minPoint] + line->getLenght())
            {
                setMinLen.erase({minLen[another], another});
                minLen[another] = minLen[minPoint] + line->getLenght();
                setMinLen.insert({minLen[another], another});
            }
        }

    }

    world::IPost *minPost = train->getPlayer()->getHome();

    for (world::IPost *post : train->getWorld()->getPostList())
        if (minLen[minPost->getPoint()] > minLen[post->getPoint()])
        {
            if (post->getPostType() == models::PostType::MARKET && train->getGoodsType() == models::GoodType::PRODUCT)
                minPost = post;

            if (post->getPostType() == models::PostType::STORAGE && train->getGoodsType() == models::GoodType::ARMOR)
                minPost = post;
        }

    return std::make_pair(minPost, minLen[minPost->getPoint()]);
}